

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

void xmlRegexpErrMemory(xmlRegParserCtxtPtr ctxt,char *extra)

{
  xmlChar *str2;
  
  if (ctxt == (xmlRegParserCtxtPtr)0x0) {
    str2 = (xmlChar *)0x0;
  }
  else {
    str2 = ctxt->string;
    ctxt->error = 2;
  }
  __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (void *)0x0,0xe,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)str2,(char *)0x0,0,0,
                  "Memory allocation failed : %s\n",extra);
  return;
}

Assistant:

static void
xmlRegexpErrMemory(xmlRegParserCtxtPtr ctxt, const char *extra)
{
    const char *regexp = NULL;
    if (ctxt != NULL) {
        regexp = (const char *) ctxt->string;
	ctxt->error = XML_ERR_NO_MEMORY;
    }
    __xmlRaiseError(NULL, NULL, NULL, NULL, NULL, XML_FROM_REGEXP,
		    XML_ERR_NO_MEMORY, XML_ERR_FATAL, NULL, 0, extra,
		    regexp, NULL, 0, 0,
		    "Memory allocation failed : %s\n", extra);
}